

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O1

void __thiscall Sandbox::onMouseDrag(Sandbox *this,float _x,float _y,int _button)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  _func_int **pp_Var6;
  Camera *pCVar7;
  float fVar8;
  float fVar9;
  float extraout_XMM0_Da;
  float fVar10;
  float fVar11;
  float extraout_XMM0_Da_00;
  undefined8 local_2c;
  undefined4 local_24;
  
  if ((this->uniforms).super_Scene.activeCamera == (Camera *)0x0) {
    return;
  }
  if (this->quilt_resolution < 0) {
    vera::getPixelDensity(false);
    iVar5 = vera::getWindowWidth();
    if (_x <= 0.0) {
      fVar11 = (float)(iVar5 + -2);
    }
    else {
      fVar11 = _x;
      if ((float)iVar5 <= _x) {
        fVar11 = 2.0;
      }
    }
    iVar5 = vera::getWindowHeight();
    if (_y <= 0.0) {
      fVar10 = (float)(iVar5 + -2);
    }
    else {
      fVar10 = _y;
      if ((float)iVar5 <= _y) {
        fVar10 = 2.0;
      }
    }
    if ((fVar11 == _x) && (!NAN(fVar11) && !NAN(_x))) {
      if ((fVar10 == _y) && (!NAN(fVar10) && !NAN(_y))) goto LAB_001c0b35;
    }
    vera::setMousePosition(fVar11,fVar10);
  }
LAB_001c0b35:
  if (_button == 1) {
    fVar8 = vera::getMouseVelX();
    fVar9 = vera::getMouseVelY();
    fVar9 = -fVar9;
    fVar11 = (this->m_view2d).value[1].field_1.y;
    fVar10 = (this->m_view2d).value[1].field_2.z;
    fVar1 = (this->m_view2d).value[0].field_1.y;
    fVar2 = (this->m_view2d).value[0].field_2.z;
    fVar3 = (this->m_view2d).value[2].field_1.y;
    fVar4 = (this->m_view2d).value[2].field_2.z;
    (this->m_view2d).value[2].field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
         (((this->m_view2d).value[1].field_0.x * fVar9 - (this->m_view2d).value[0].field_0.x * fVar8
          ) + (this->m_view2d).value[2].field_0.x);
    (this->m_view2d).value[2].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
         ((fVar11 * fVar9 - fVar1 * fVar8) + fVar3);
    (this->m_view2d).value[2].field_2.z = (fVar9 * fVar10 - fVar8 * fVar2) + fVar4;
    (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4f])();
    fVar10 = vera::getMouseVelX();
    fVar11 = vera::getMouseVelY();
    if (50.0 <= ABS(fVar10)) {
      return;
    }
    if (50.0 <= ABS(fVar11)) {
      return;
    }
    fVar10 = this->m_camera_azimuth - fVar10;
    this->m_camera_azimuth = fVar10;
    fVar1 = fVar11 * -0.5 + this->m_camera_elevation;
    this->m_camera_elevation = fVar1;
    pCVar7 = (this->uniforms).super_Scene.activeCamera;
    pp_Var6 = (pCVar7->super_Node)._vptr_Node;
    fVar11 = extraout_XMM0_Da;
  }
  else {
    (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4f])();
    fVar11 = vera::getMouseVelY();
    fVar11 = fVar11 * -0.008 + extraout_XMM0_Da_00;
    if (fVar11 <= 0.0) {
      return;
    }
    pCVar7 = (this->uniforms).super_Scene.activeCamera;
    fVar10 = this->m_camera_azimuth;
    fVar1 = this->m_camera_elevation;
    pp_Var6 = (pCVar7->super_Node)._vptr_Node;
  }
  local_24 = 0;
  local_2c = 0;
  (*pp_Var6[0x29])(fVar10,(ulong)(uint)fVar1,fVar11,pCVar7,&local_2c);
  pCVar7 = (this->uniforms).super_Scene.activeCamera;
  local_2c = 0;
  local_24 = 0;
  (*(pCVar7->super_Node)._vptr_Node[0x30])(0,0,pCVar7,&local_2c);
  return;
}

Assistant:

void Sandbox::onMouseDrag(float _x, float _y, int _button) {
    if (uniforms.activeCamera == nullptr)
        return;

    if (quilt_resolution < 0) {
        // If it's not playing on the HOLOPLAY
        // produce continue draging like blender
        //
        float x = _x;
        float y = _y;
        float pd = vera::getPixelDensity();

        if (x <= 0) x = vera::getWindowWidth() - 2;
        else if (x >= vera::getWindowWidth()) x = 2; 

        if (y <= 0) y = vera::getWindowHeight() - 2;
        else if (y >= vera::getWindowHeight()) y = 2;

        if (x != _x || y != _y) vera::setMousePosition(x, y);
    }

    if (_button == 1) {
        // Left-button drag is used to pan u_view2d.
        m_view2d = glm::translate(m_view2d, glm::vec2(-vera::getMouseVelX(),-vera::getMouseVelY()) );

        // Left-button drag is used to rotate geometry.
        float dist = uniforms.activeCamera->getDistance();

        float vel_x = vera::getMouseVelX();
        float vel_y = vera::getMouseVelY();

        if (fabs(vel_x) < 50.0 && fabs(vel_y) < 50.0) {
            m_camera_azimuth -= vel_x;
            m_camera_elevation -= vel_y * 0.5;
            uniforms.activeCamera->orbit(m_camera_azimuth, m_camera_elevation, dist);
            uniforms.activeCamera->lookAt(glm::vec3(0.0));
        }
    } 
    else {
        // Right-button drag is used to zoom geometry.
        float dist = uniforms.activeCamera->getDistance();
        dist += (-.008f * vera::getMouseVelY());
        if (dist > 0.0f) {
            uniforms.activeCamera->orbit(m_camera_azimuth, m_camera_elevation, dist);
            uniforms.activeCamera->lookAt(glm::vec3(0.0));
        }
    }
}